

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaB_pcall(lua_State *L)

{
  int iVar1;
  int status;
  lua_State *L_local;
  
  luaL_checkany(L,1);
  iVar1 = lua_gettop(L);
  iVar1 = lua_pcall(L,iVar1 + -1,-1,0);
  lua_pushboolean(L,(uint)(iVar1 == 0));
  lua_insert(L,1);
  iVar1 = lua_gettop(L);
  return iVar1;
}

Assistant:

static int luaB_pcall(lua_State*L){
int status;
luaL_checkany(L,1);
status=lua_pcall(L,lua_gettop(L)-1,(-1),0);
lua_pushboolean(L,(status==0));
lua_insert(L,1);
return lua_gettop(L);
}